

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlParserCtxtPtr xmlCreateDocParserCtxt(xmlChar *str)

{
  int iVar1;
  xmlParserInputPtr value;
  xmlParserInputPtr input;
  xmlParserCtxtPtr ctxt;
  xmlChar *str_local;
  
  str_local = (xmlChar *)xmlNewParserCtxt();
  if ((xmlParserCtxtPtr)str_local == (xmlParserCtxtPtr)0x0) {
    str_local = (xmlChar *)0x0;
  }
  else {
    value = xmlCtxtNewInputFromString
                      ((xmlParserCtxtPtr)str_local,(char *)0x0,(char *)str,(char *)0x0,0);
    if (value == (xmlParserInputPtr)0x0) {
      xmlFreeParserCtxt((xmlParserCtxtPtr)str_local);
      str_local = (xmlChar *)0x0;
    }
    else {
      iVar1 = xmlCtxtPushInput((xmlParserCtxtPtr)str_local,value);
      if (iVar1 < 0) {
        xmlFreeInputStream(value);
        xmlFreeParserCtxt((xmlParserCtxtPtr)str_local);
        str_local = (xmlChar *)0x0;
      }
    }
  }
  return (xmlParserCtxtPtr)str_local;
}

Assistant:

xmlParserCtxtPtr
xmlCreateDocParserCtxt(const xmlChar *str) {
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;

    ctxt = xmlNewParserCtxt();
    if (ctxt == NULL)
	return(NULL);

    input = xmlCtxtNewInputFromString(ctxt, NULL, (const char *) str, NULL, 0);
    if (input == NULL) {
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }
    if (xmlCtxtPushInput(ctxt, input) < 0) {
        xmlFreeInputStream(input);
        xmlFreeParserCtxt(ctxt);
        return(NULL);
    }

    return(ctxt);
}